

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_writeclosure(HSQUIRRELVM v,SQWRITEFUNC w,SQUserPointer up)

{
  SQObjectPtr *pSVar1;
  bool bVar2;
  SQInteger SVar3;
  char *err;
  unsigned_short tag;
  SQObjectPtr *o;
  undefined2 local_2a;
  SQObjectPtr *local_28;
  
  local_28 = (SQObjectPtr *)0x0;
  bVar2 = sq_aux_gettypedarg(v,-1,OT_CLOSURE,&local_28);
  pSVar1 = local_28;
  if (bVar2) {
    local_2a = 0xfafa;
    if (((local_28->super_SQObject)._unVal.pClosure)->_function->_noutervalues == 0) {
      SVar3 = (*w)(up,&local_2a,2);
      if (SVar3 == 2) {
        bVar2 = SQClosure::Save((pSVar1->super_SQObject)._unVal.pClosure,v,up,w);
        return (ulong)bVar2 - 1;
      }
      err = "io error";
    }
    else {
      err = "a closure with free valiables bound it cannot be serialized";
    }
    sq_throwerror(v,err);
  }
  return -1;
}

Assistant:

SQRESULT sq_writeclosure(HSQUIRRELVM v,SQWRITEFUNC w,SQUserPointer up)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, -1, OT_CLOSURE,o);
    unsigned short tag = SQ_BYTECODE_STREAM_TAG;
    if(_closure(*o)->_function->_noutervalues)
        return sq_throwerror(v,_SC("a closure with free valiables bound it cannot be serialized"));
    if(w(up,&tag,2) != 2)
        return sq_throwerror(v,_SC("io error"));
    if(!_closure(*o)->Save(v,up,w))
        return SQ_ERROR;
    return SQ_OK;
}